

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2.c
# Opt level: O0

void argon2(Argon2Flavour flavour,uint32_t mem,uint32_t passes,uint32_t parallel,uint32_t taglen,
           ptrlen P,ptrlen S,ptrlen K,ptrlen X,strbuf *out)

{
  uint8_t *out_00;
  strbuf *out_local;
  uint32_t taglen_local;
  uint32_t parallel_local;
  uint32_t passes_local;
  uint32_t mem_local;
  Argon2Flavour flavour_local;
  
  out_00 = (uint8_t *)strbuf_append(out,(ulong)taglen);
  argon2_internal(parallel,taglen,mem,passes,flavour,P,S,K,X,out_00);
  return;
}

Assistant:

void argon2(Argon2Flavour flavour, uint32_t mem, uint32_t passes,
            uint32_t parallel, uint32_t taglen,
            ptrlen P, ptrlen S, ptrlen K, ptrlen X, strbuf *out)
{
    argon2_internal(parallel, taglen, mem, passes, flavour,
                    P, S, K, X, strbuf_append(out, taglen));
}